

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

size_t strlen_url(char *url)

{
  bool bVar1;
  size_t sStack_20;
  _Bool left;
  size_t newlen;
  char *ptr;
  char *url_local;
  
  sStack_20 = 0;
  bVar1 = true;
  for (newlen = (size_t)url; *(char *)newlen != '\0'; newlen = newlen + 1) {
    if (*(char *)newlen == ' ') {
      if (bVar1) {
        sStack_20 = sStack_20 + 3;
      }
      else {
        sStack_20 = sStack_20 + 1;
      }
    }
    else {
      if (*(char *)newlen == '?') {
        bVar1 = false;
      }
      sStack_20 = sStack_20 + 1;
    }
  }
  return sStack_20;
}

Assistant:

static size_t strlen_url(const char *url)
{
  const char *ptr;
  size_t newlen=0;
  bool left=TRUE; /* left side of the ? */

  for(ptr=url; *ptr; ptr++) {
    switch(*ptr) {
    case '?':
      left=FALSE;
      /* fall through */
    default:
      newlen++;
      break;
    case ' ':
      if(left)
        newlen+=3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}